

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::CreateShadProgCase::iterate(CreateShadProgCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar6;
  char *srcStrings [10];
  char *local_208 [4];
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  Functions *gl;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Begin:CreateShadProgCase iterate",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  local_208[0] = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  local_208[1] = "\n";
  lVar6 = 2;
  if (8 < (int)this->m_glslVersion) {
    local_208[2] = "out gl_PerVertex {\n  vec4 gl_Position;\n};\n";
    lVar6 = 3;
  }
  local_208[lVar6] = "in vec4 a_position;\n";
  local_208[lVar6 + 1] = "void main ()\n";
  local_208[lVar6 + 2] = "{\n";
  local_208[lVar6 + 3] = "    gl_Position = a_position;\n";
  local_208[lVar6 + 4] = "}\n";
  GVar4 = (*gl->createShaderProgramv)(0x8b31,(int)lVar6 + 5,local_208);
  bVar2 = checkCSProg(this,gl,GVar4,1,1);
  if (bVar2) {
    (*gl->deleteProgram)(GVar4);
    local_208[0] = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    local_208[1] = "\n";
    lVar6 = 2;
    if (8 < (int)this->m_glslVersion) {
      local_208[2] = "out gl_PerVertex {\n  vec4 gl_Position;\n};\n";
      lVar6 = 3;
    }
    local_208[lVar6] = "in vec4 a_position;\nvoid main ()\n";
    local_208[lVar6 + 1] = "{\n    gl_Position = a_position;\n";
    local_208[lVar6 + 2] = "}\n";
    GVar4 = (*gl->createShaderProgramv)(0x8b31,(int)lVar6 + 3,local_208);
    bVar2 = checkCSProg(this,gl,GVar4,1,1);
    if (bVar2) {
      (*gl->deleteProgram)(GVar4);
      local_208[0] = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      local_208[1] = "\nin highp vec4 u_color;\n";
      local_208[2] = "layout(location = 0) out mediump vec4 o_color;\n";
      local_208[3] = "void main ()\n";
      local_1e8 = "{\n";
      local_1e0 = "    o_color = u_color;\n";
      local_1d8 = "}\n";
      GVar4 = (*gl->createShaderProgramv)(0x8b30,7,local_208);
      bVar2 = checkCSProg(this,gl,GVar4,1,1);
      if (bVar2) {
        (*gl->deleteProgram)(GVar4);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"CreateShaderProgramv failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x273);
        GVar4 = (*gl->createShaderProgramv)(0x8dfd,7,local_208);
        GVar5 = (*gl->getError)();
        if ((GVar4 == 0) && (GVar5 == 0x500)) {
          GVar4 = (*gl->createShaderProgramv)(0x8b30,-1,local_208);
          GVar5 = (*gl->getError)();
          if ((GVar4 == 0) && (GVar5 == 0x501)) {
            local_208[0] = glu::getGLSLVersionDeclaration(this->m_glslVersion);
            local_208[1] = "\nin highp vec4 u_color;\n";
            local_208[2] = "layout(location = 0) out mediump vec4 o_color;\n";
            local_208[3] = "void main ()\n";
            local_1e8 = "{\n";
            local_1e0 = "    o_color = u_color;\n";
            GVar4 = (*gl->createShaderProgramv)(0x8b30,6,local_208);
            bVar2 = checkCSProg(this,gl,GVar4,0,0);
            if (bVar2) {
              GVar5 = (*gl->getError)();
              glu::checkError(GVar5,"CreateShaderProgramv failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                              ,0x296);
              (*gl->deleteProgram)(GVar4);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_PASS,"Pass");
              return STOP;
            }
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x294);
          }
          else {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,"CreateShaderProgramv failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x284);
          }
        }
        else {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"CreateShaderProgramv failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x27c);
        }
      }
      else {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x26e);
      }
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x25c);
    }
  }
  else {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x244);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		int					  i;
		const char*			  srcStrings[10];
		glw::GLuint			  program;
		glw::GLenum			  err;

		// CreateShaderProgramv verification
		log << TestLog::Message << "Begin:CreateShadProgCase iterate" << TestLog::EndMessage;

		// vertex shader
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\n";
		if (m_glslVersion >= glu::GLSL_VERSION_410)
		{
			srcStrings[i++] = "out gl_PerVertex {\n"
							  "  vec4 gl_Position;\n"
							  "};\n";
		}
		srcStrings[i++] = "in vec4 a_position;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    gl_Position = a_position;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_VERTEX_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}

		gl.deleteProgram(program);

		// Half as many strings
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\n";
		if (m_glslVersion >= glu::GLSL_VERSION_410)
		{
			srcStrings[i++] = "out gl_PerVertex {\n"
							  "  vec4 gl_Position;\n"
							  "};\n";
		}
		srcStrings[i++] = "in vec4 a_position;\n"
						  "void main ()\n";
		srcStrings[i++] = "{\n"
						  "    gl_Position = a_position;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_VERTEX_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}

		gl.deleteProgram(program);

		// Fragment shader
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\nin highp vec4 u_color;\n";
		srcStrings[i++] = "layout(location = 0) out mediump vec4 o_color;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    o_color = u_color;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}

		gl.deleteProgram(program);

		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShaderProgramv failed");

		// Negative Cases

		// invalid type
		program = gl.createShaderProgramv(GL_MAX_FRAGMENT_UNIFORM_VECTORS, i, srcStrings);
		err		= gl.getError();
		if ((program != 0) || (err != GL_INVALID_ENUM))
		{
			TCU_FAIL("CreateShaderProgramv failed");
		}

		// Negative count
		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, -1, srcStrings);
		err		= gl.getError();
		if ((program != 0) || (err != GL_INVALID_VALUE))
		{
			TCU_FAIL("CreateShaderProgramv failed");
		}

		// source compile error
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\nin highp vec4 u_color;\n";
		srcStrings[i++] = "layout(location = 0) out mediump vec4 o_color;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    o_color = u_color;\n";

		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, i, srcStrings);
		// expect valid program and false for link status
		if (!checkCSProg(gl, program, GL_FALSE, GL_FALSE))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShaderProgramv failed");
		gl.deleteProgram(program);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}